

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O1

void remote_deq(Block *param_1,ProxyWithLink *cp,int nblocks)

{
  _Rb_tree_header *p_Var1;
  IncomingQueues *this;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  long lVar4;
  ulong uVar5;
  string_view format_str;
  format_args args;
  int recvd_data;
  int received;
  vector<int,_std::allocator<int>_> incoming_gids;
  uint local_e0;
  int local_dc;
  int *local_d8;
  iterator iStack_d0;
  int *local_c8;
  AssertionHandler local_b8;
  int local_6c;
  int local_68;
  int local_64;
  undefined **local_60;
  undefined1 local_58;
  undefined1 local_57;
  uint *local_50;
  char *local_48;
  undefined8 local_40;
  uint *local_38;
  
  local_d8 = (int *)0x0;
  iStack_d0._M_current = (int *)0x0;
  local_c8 = (int *)0x0;
  p_Var2 = (cp->super_Proxy).incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(cp->super_Proxy).incoming_._M_t._M_impl.super__Rb_tree_header;
  local_6c = nblocks;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    do {
      if (iStack_d0._M_current == local_c8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_d8,iStack_d0,(int *)(p_Var2 + 1));
      }
      else {
        *iStack_d0._M_current = p_Var2[1]._M_color;
        iStack_d0._M_current = iStack_d0._M_current + 1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  local_dc = 0;
  if (iStack_d0._M_current != local_d8) {
    this = &(cp->super_Proxy).incoming_;
    lVar4 = 0;
    uVar5 = 0;
    do {
      local_b8.m_assertionInfo.macroName.m_start =
           (char *)CONCAT44(local_b8.m_assertionInfo.macroName.m_start._4_4_,local_d8[uVar5]);
      pmVar3 = Catch::clara::std::
               map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
               ::operator[](this,(key_type *)&local_b8);
      if ((pmVar3->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pmVar3->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_dc = local_dc + 1;
        local_b8.m_assertionInfo.macroName.m_start =
             (char *)CONCAT44(local_b8.m_assertionInfo.macroName.m_start._4_4_,local_d8[uVar5]);
        pmVar3 = Catch::clara::std::
                 map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                 ::operator[](this,(key_type *)&local_b8);
        (*(pmVar3->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar3,&local_e0,4);
        local_b8.m_assertionInfo.macroName.m_start = (char *)(ulong)(uint)(cp->super_Proxy).gid_;
        local_b8.m_assertionInfo.lineInfo.file = (char *)(ulong)local_e0;
        local_b8.m_assertionInfo.capturedExpression.m_start = (char *)(ulong)(uint)local_d8[uVar5];
        format_str.size_ = 0x35;
        format_str.data_ = "Remote dequeue: gid {} received value {} from gid {}\n";
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_b8;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = 0x111;
        fmt::v7::vprint(_stderr,format_str,args);
        local_b8.m_assertionInfo.macroName.m_start = "CHECK";
        local_b8.m_assertionInfo.macroName.m_size = 5;
        local_b8.m_assertionInfo.lineInfo.file =
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/rexchange.cpp";
        local_b8.m_assertionInfo.lineInfo.line = 0x5f;
        local_b8.m_assertionInfo.capturedExpression.m_start = "recvd_data == incoming_gids[i]";
        local_b8.m_assertionInfo.capturedExpression.m_size = 0x1e;
        local_b8.m_assertionInfo.resultDisposition = ContinueOnFailure;
        local_b8.m_reaction.shouldDebugBreak = false;
        local_b8.m_reaction.shouldThrow = false;
        local_b8.m_completed = false;
        local_b8.m_resultCapture = Catch::getResultCapture();
        local_57 = local_e0 == *(uint *)((long)local_d8 + lVar4);
        local_58 = 1;
        local_38 = (uint *)((long)local_d8 + lVar4);
        local_60 = &PTR_streamReconstructedExpression_001c3908;
        local_50 = &local_e0;
        local_48 = "==";
        local_40 = 2;
        (*(local_b8.m_resultCapture)->_vptr_IResultCapture[10])
                  (local_b8.m_resultCapture,
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&local_b8,&local_60,&local_b8.m_reaction);
        Catch::AssertionHandler::complete(&local_b8);
        if (local_b8.m_completed == false) {
          (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_b8.m_resultCapture,
                     (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&local_b8);
        }
        local_b8.m_assertionInfo.macroName.m_start = "CHECK";
        local_b8.m_assertionInfo.macroName.m_size = 5;
        local_b8.m_assertionInfo.lineInfo.file =
             "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/rexchange.cpp";
        local_b8.m_assertionInfo.lineInfo.line = 0x60;
        local_b8.m_assertionInfo.capturedExpression.m_start =
             "(recvd_data + 2) % nblocks == cp.gid()";
        local_b8.m_assertionInfo.capturedExpression.m_size = 0x26;
        local_b8.m_assertionInfo.resultDisposition = ContinueOnFailure;
        local_b8.m_reaction.shouldDebugBreak = false;
        local_b8.m_reaction.shouldThrow = false;
        local_b8.m_completed = false;
        local_b8.m_resultCapture = Catch::getResultCapture();
        local_64 = (int)(local_e0 + 2) % local_6c;
        local_68 = (cp->super_Proxy).gid_;
        local_57 = local_64 == local_68;
        local_58 = 1;
        local_60 = &PTR_streamReconstructedExpression_001c3908;
        local_50 = (uint *)&local_64;
        local_48 = "==";
        local_40 = 2;
        local_38 = (uint *)&local_68;
        (*(local_b8.m_resultCapture)->_vptr_IResultCapture[10])
                  (local_b8.m_resultCapture,
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&local_b8,&local_60,&local_b8.m_reaction);
        Catch::AssertionHandler::complete(&local_b8);
        if (local_b8.m_completed == false) {
          (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_b8.m_resultCapture,
                     (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&local_b8);
        }
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (uVar5 < (ulong)((long)iStack_d0._M_current - (long)local_d8 >> 2));
  }
  local_b8.m_assertionInfo.macroName.m_start = "CHECK";
  local_b8.m_assertionInfo.macroName.m_size = 5;
  local_b8.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/rexchange.cpp";
  local_b8.m_assertionInfo.lineInfo.line = 0x62;
  local_b8.m_assertionInfo.capturedExpression.m_start = "received == 1";
  local_b8.m_assertionInfo.capturedExpression.m_size = 0xd;
  local_b8.m_assertionInfo.resultDisposition = ContinueOnFailure;
  local_b8.m_reaction.shouldDebugBreak = false;
  local_b8.m_reaction.shouldThrow = false;
  local_b8.m_completed = false;
  local_b8.m_resultCapture = Catch::getResultCapture();
  local_38 = &local_e0;
  local_e0 = 1;
  local_50 = (uint *)&local_dc;
  local_57 = local_dc == 1;
  local_58 = 1;
  local_60 = &PTR_streamReconstructedExpression_001c3908;
  local_48 = "==";
  local_40 = 2;
  (*(local_b8.m_resultCapture)->_vptr_IResultCapture[10])(local_b8.m_resultCapture,&local_b8);
  Catch::AssertionHandler::complete(&local_b8);
  if (local_b8.m_completed == false) {
    (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_d8 != (int *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  return;
}

Assistant:

void remote_deq(Block*,
                const diy::Master::ProxyWithLink&   cp,
                int                                 nblocks)       // only need nblocks for testing
{
    std::vector<int> incoming_gids;
    cp.incoming(incoming_gids);
    int received = 0;
    for (size_t i = 0; i < incoming_gids.size(); i++)
        if (cp.incoming(incoming_gids[i]).size())
        {
            ++received;
            int recvd_data;
            // same as cp.dequeue(incoming_gids[i], recvd_data), but using this variant for
            // testing coverage.
            cp.dequeue(incoming_gids[i], &recvd_data, 1);
            fmt::print(stderr, "Remote dequeue: gid {} received value {} from gid {}\n",
                    cp.gid(), recvd_data, incoming_gids[i]);
            CHECK(recvd_data == incoming_gids[i]);
            CHECK((recvd_data + 2) % nblocks == cp.gid());
        }
    CHECK(received == 1);
}